

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TextureSpecCase::renderTexCube
          (TextureSpecCase *this,Surface *dst,int width,int height,CubeFace face)

{
  TexCubeShader *this_00;
  deUint32 program;
  int iVar1;
  int iVar2;
  Context *pCVar3;
  Vector<float,_3> local_84;
  Vector<float,_3> local_78;
  deUint32 local_6c;
  TexCubeShader *pTStack_68;
  deUint32 shaderID;
  TexCubeShader *shaders [6];
  float h;
  float w;
  int targetH;
  int targetW;
  CubeFace face_local;
  int height_local;
  int width_local;
  Surface *dst_local;
  TextureSpecCase *this_local;
  
  iVar1 = sglr::ContextWrapper::getWidth(&this->super_ContextWrapper);
  iVar2 = sglr::ContextWrapper::getHeight(&this->super_ContextWrapper);
  shaders[5]._4_4_ = (float)height / (float)iVar2;
  pTStack_68 = &this->m_texCubeNegXShader;
  shaders[0] = &this->m_texCubePosXShader;
  shaders[1] = &this->m_texCubeNegYShader;
  shaders[2] = &this->m_texCubePosYShader;
  shaders[3] = &this->m_texCubeNegZShader;
  shaders[4] = &this->m_texCubePosZShader;
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&this->super_ContextWrapper);
  local_6c = (*pCVar3->_vptr_Context[0x75])(pCVar3,shaders[(ulong)face - 1]);
  this_00 = shaders[(ulong)face - 1];
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&this->super_ContextWrapper);
  TexCubeShader::setUniforms(this_00,pCVar3,local_6c);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&this->super_ContextWrapper);
  program = local_6c;
  tcu::Vector<float,_3>::Vector(&local_78,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector
            (&local_84,(float)width / (float)iVar1 + (float)width / (float)iVar1 + -1.0,
             shaders[5]._4_4_ + shaders[5]._4_4_ + -1.0,0.0);
  sglr::drawQuad(pCVar3,program,&local_78,&local_84);
  readPixels(this,dst,0,0,width,height);
  return;
}

Assistant:

void TextureSpecCase::renderTexCube (tcu::Surface& dst, int width, int height, tcu::CubeFace face)
{
	int		targetW		= getWidth();
	int		targetH		= getHeight();

	float	w			= (float)width	/ (float)targetW;
	float	h			= (float)height	/ (float)targetH;

	TexCubeShader* shaders[] =
	{
		&m_texCubeNegXShader,
		&m_texCubePosXShader,
		&m_texCubeNegYShader,
		&m_texCubePosYShader,
		&m_texCubeNegZShader,
		&m_texCubePosZShader
	};

	deUint32	shaderID	= getCurrentContext()->createProgram(shaders[face]);

	shaders[face]->setUniforms(*getCurrentContext(), shaderID);
	sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f + w*2.0f, -1.0f + h*2.0f, 0.0f));

	// Read pixels back.
	readPixels(dst, 0, 0, width, height);
}